

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

void Io_Write(Abc_Ntk_t *pNtk,char *pFileName,Io_FileType_t FileType)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtkCopy;
  Abc_Ntk_t *pNtkTemp;
  Io_FileType_t FileType_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    fprintf(_stdout,"Empty network.\n");
  }
  else if ((FileType == IO_FILE_NONE) || (FileType == IO_FILE_UNKNOWN)) {
    fprintf(_stdout,"The generic file writer requires a known file extension.\n");
  }
  else if ((FileType == IO_FILE_AIGER) || (FileType == IO_FILE_BAF)) {
    iVar1 = Abc_NtkIsStrash(pNtk);
    if (iVar1 == 0) {
      fprintf(_stdout,"Writing this format is only possible for structurally hashed AIGs.\n");
    }
    else if (FileType == IO_FILE_AIGER) {
      Io_WriteAiger(pNtk,pFileName,1,0,0);
    }
    else {
      Io_WriteBaf(pNtk,pFileName);
    }
  }
  else if (FileType == IO_FILE_CNF) {
    Io_WriteCnf(pNtk,pFileName,0);
  }
  else if (FileType == IO_FILE_DOT) {
    Io_WriteDot(pNtk,pFileName);
  }
  else if (FileType == IO_FILE_GML) {
    Io_WriteGml(pNtk,pFileName);
  }
  else if (FileType == IO_FILE_BBLIF) {
    iVar1 = Abc_NtkIsLogic(pNtk);
    if (iVar1 == 0) {
      fprintf(_stdout,"Writing Binary BLIF is only possible for logic networks.\n");
    }
    else {
      iVar1 = Abc_NtkHasSop(pNtk);
      if (iVar1 == 0) {
        Abc_NtkToSop(pNtk,-1,1000000000);
      }
      Io_WriteBblif(pNtk,pFileName);
    }
  }
  else {
    if (FileType == IO_FILE_PLA) {
      iVar1 = Abc_NtkLevel(pNtk);
      if (1 < iVar1) {
        fprintf(_stdout,"PLA writing is available for collapsed networks.\n");
        return;
      }
      iVar1 = Abc_NtkIsComb(pNtk);
      if (iVar1 == 0) {
        fprintf(_stdout,"Latches are writen into the PLA file at PI/PO pairs.\n");
        pNtk_00 = Abc_NtkDup(pNtk);
        Abc_NtkMakeComb(pNtk_00,0);
        pNtkCopy = Abc_NtkToNetlist(pNtk);
        Abc_NtkDelete(pNtk_00);
      }
      else {
        pNtkCopy = Abc_NtkToNetlist(pNtk);
      }
      iVar1 = Abc_NtkToSop(pNtkCopy,1,1000000000);
      if (iVar1 == 0) {
        return;
      }
    }
    else if (FileType == IO_FILE_MOPLA) {
      pNtkCopy = Abc_NtkStrash(pNtk,0,0,0);
    }
    else if (FileType == IO_FILE_BENCH) {
      iVar1 = Abc_NtkIsStrash(pNtk);
      if (iVar1 == 0) {
        fprintf(_stdout,
                "Writing traditional BENCH is available for AIGs only (use \"write_bench\").\n");
        return;
      }
      pNtkCopy = Abc_NtkToNetlistBench(pNtk);
    }
    else if (FileType == IO_FILE_SMV) {
      iVar1 = Abc_NtkIsStrash(pNtk);
      if (iVar1 == 0) {
        fprintf(_stdout,"Writing traditional SMV is available for AIGs only.\n");
        return;
      }
      pNtkCopy = Abc_NtkToNetlistBench(pNtk);
    }
    else {
      pNtkCopy = Abc_NtkToNetlist(pNtk);
    }
    if (pNtkCopy == (Abc_Ntk_t *)0x0) {
      fprintf(_stdout,"Converting to netlist has failed.\n");
    }
    else {
      if (FileType == IO_FILE_BLIF) {
        iVar1 = Abc_NtkHasSop(pNtkCopy);
        if ((iVar1 == 0) && (iVar1 = Abc_NtkHasMapping(pNtkCopy), iVar1 == 0)) {
          Abc_NtkToSop(pNtkCopy,-1,1000000000);
        }
        Io_WriteBlif(pNtkCopy,pFileName,1,0,0);
      }
      else if (FileType == IO_FILE_BLIFMV) {
        iVar1 = Abc_NtkConvertToBlifMv(pNtkCopy);
        if (iVar1 == 0) {
          return;
        }
        Io_WriteBlifMv(pNtkCopy,pFileName);
      }
      else if (FileType == IO_FILE_BENCH) {
        Io_WriteBench(pNtkCopy,pFileName);
      }
      else if (FileType == IO_FILE_BOOK) {
        Io_WriteBook(pNtkCopy,pFileName);
      }
      else if (FileType == IO_FILE_PLA) {
        Io_WritePla(pNtkCopy,pFileName);
      }
      else if (FileType == IO_FILE_MOPLA) {
        Io_WriteMoPla(pNtkCopy,pFileName);
      }
      else if (FileType == IO_FILE_EQN) {
        iVar1 = Abc_NtkHasAig(pNtkCopy);
        if (iVar1 == 0) {
          Abc_NtkToAig(pNtkCopy);
        }
        Io_WriteEqn(pNtkCopy,pFileName);
      }
      else if (FileType == IO_FILE_SMV) {
        Io_WriteSmv(pNtkCopy,pFileName);
      }
      else if (FileType == IO_FILE_VERILOG) {
        iVar1 = Abc_NtkHasAig(pNtkCopy);
        if ((iVar1 == 0) && (iVar1 = Abc_NtkHasMapping(pNtkCopy), iVar1 == 0)) {
          Abc_NtkToAig(pNtkCopy);
        }
        Io_WriteVerilog(pNtkCopy,pFileName,0);
      }
      else {
        fprintf(_stderr,"Unknown file format.\n");
      }
      Abc_NtkDelete(pNtkCopy);
    }
  }
  return;
}

Assistant:

void Io_Write( Abc_Ntk_t * pNtk, char * pFileName, Io_FileType_t FileType )
{
    Abc_Ntk_t * pNtkTemp, * pNtkCopy;
    // check if the current network is available
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Empty network.\n" );
        return;
    }
    // check if the file extension if given
    if ( FileType == IO_FILE_NONE || FileType == IO_FILE_UNKNOWN )
    {
        fprintf( stdout, "The generic file writer requires a known file extension.\n" );
        return;
    }
    // write the AIG formats
    if ( FileType == IO_FILE_AIGER || FileType == IO_FILE_BAF )
    {
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            fprintf( stdout, "Writing this format is only possible for structurally hashed AIGs.\n" );
            return;
        }
        if ( FileType == IO_FILE_AIGER )
            Io_WriteAiger( pNtk, pFileName, 1, 0, 0 );
        else //if ( FileType == IO_FILE_BAF )
            Io_WriteBaf( pNtk, pFileName );
        return;
    }
    // write non-netlist types
    if ( FileType == IO_FILE_CNF )
    {
        Io_WriteCnf( pNtk, pFileName, 0 );
        return;
    }
    if ( FileType == IO_FILE_DOT )
    {
        Io_WriteDot( pNtk, pFileName );
        return;
    }
    if ( FileType == IO_FILE_GML )
    {
        Io_WriteGml( pNtk, pFileName );
        return;
    }
    if ( FileType == IO_FILE_BBLIF )
    {
        if ( !Abc_NtkIsLogic(pNtk) )
        {
            fprintf( stdout, "Writing Binary BLIF is only possible for logic networks.\n" );
            return;
        }
        if ( !Abc_NtkHasSop(pNtk) )
            Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
        Io_WriteBblif( pNtk, pFileName );
        return;
    }
/*
    if ( FileType == IO_FILE_BLIFMV )
    {
        Io_WriteBlifMv( pNtk, pFileName );
        return;
    }
*/
    // convert logic network into netlist
    if ( FileType == IO_FILE_PLA )
    {
        if ( Abc_NtkLevel(pNtk) > 1 )
        {
            fprintf( stdout, "PLA writing is available for collapsed networks.\n" );
            return;
        }
        if ( Abc_NtkIsComb(pNtk) )
            pNtkTemp = Abc_NtkToNetlist( pNtk );
        else
        {
            fprintf( stdout, "Latches are writen into the PLA file at PI/PO pairs.\n" );
            pNtkCopy = Abc_NtkDup( pNtk );
            Abc_NtkMakeComb( pNtkCopy, 0 );
            pNtkTemp = Abc_NtkToNetlist( pNtk );
            Abc_NtkDelete( pNtkCopy );
        }
        if ( !Abc_NtkToSop( pNtkTemp, 1, ABC_INFINITY ) )
            return;
    }
    else if ( FileType == IO_FILE_MOPLA )
    {
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
    }
    else if ( FileType == IO_FILE_BENCH )
    {
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            fprintf( stdout, "Writing traditional BENCH is available for AIGs only (use \"write_bench\").\n" );
            return;
        }
        pNtkTemp = Abc_NtkToNetlistBench( pNtk );
    }
    else if ( FileType == IO_FILE_SMV )
    {
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            fprintf( stdout, "Writing traditional SMV is available for AIGs only.\n" );
            return;
        }
        pNtkTemp = Abc_NtkToNetlistBench( pNtk );
    }
    else
        pNtkTemp = Abc_NtkToNetlist( pNtk );

    if ( pNtkTemp == NULL )
    {
        fprintf( stdout, "Converting to netlist has failed.\n" );
        return;
    }

    if ( FileType == IO_FILE_BLIF )
    {
        if ( !Abc_NtkHasSop(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
            Abc_NtkToSop( pNtkTemp, -1, ABC_INFINITY );
        Io_WriteBlif( pNtkTemp, pFileName, 1, 0, 0 );
    }
    else if ( FileType == IO_FILE_BLIFMV )
    {
        if ( !Abc_NtkConvertToBlifMv( pNtkTemp ) )
            return;
        Io_WriteBlifMv( pNtkTemp, pFileName );
    }
    else if ( FileType == IO_FILE_BENCH )
        Io_WriteBench( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_BOOK )
        Io_WriteBook( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_PLA )
        Io_WritePla( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_MOPLA )
        Io_WriteMoPla( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_EQN )
    {
        if ( !Abc_NtkHasAig(pNtkTemp) )
            Abc_NtkToAig( pNtkTemp );
        Io_WriteEqn( pNtkTemp, pFileName );
    }
    else if ( FileType == IO_FILE_SMV )
        Io_WriteSmv( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_VERILOG )
    {
        if ( !Abc_NtkHasAig(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
            Abc_NtkToAig( pNtkTemp );
        Io_WriteVerilog( pNtkTemp, pFileName, 0 );
    }
    else 
        fprintf( stderr, "Unknown file format.\n" );
    Abc_NtkDelete( pNtkTemp );
}